

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O1

void __thiscall ncnn::Convolution1D::Convolution1D(Convolution1D *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Convolution1D_005e3e40;
  (this->activation_params).cstep = 0;
  (this->bias_data).cstep = 0;
  (this->activation_params).data = (void *)0x0;
  (this->activation_params).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->activation_params).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->activation_params).elemsize + 4) = 0;
  (this->activation_params).allocator = (Allocator *)0x0;
  (this->activation_params).dims = 0;
  (this->activation_params).w = 0;
  (this->activation_params).w = 0;
  (this->activation_params).h = 0;
  (this->activation_params).d = 0;
  (this->activation_params).c = 0;
  (this->weight_data).data = (void *)0x0;
  (this->weight_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
  (this->weight_data).allocator = (Allocator *)0x0;
  (this->weight_data).dims = 0;
  (this->weight_data).w = 0;
  (this->weight_data).w = 0;
  (this->weight_data).h = 0;
  (this->weight_data).d = 0;
  (this->weight_data).c = 0;
  (this->weight_data).cstep = 0;
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).elempack = 0;
  (this->bias_data).allocator = (Allocator *)0x0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).d = 0;
  (this->bias_data).c = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

Convolution1D::Convolution1D()
{
    one_blob_only = true;
    support_inplace = false;
}